

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  reference pbVar6;
  undefined1 auVar7 [16];
  cmMakeSafe local_298;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  string local_218;
  cmMakeSafe local_1f8;
  cmMakeSafe local_1f0;
  string local_1e8;
  string local_1c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  const_iterator dep;
  undefined1 local_190 [8];
  string binDir;
  cmMakeSafe local_168;
  allocator local_159;
  string local_158;
  char *local_138;
  char *sym;
  char *space;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  string tgt;
  string local_a0 [32];
  long local_80;
  size_type rpos;
  size_type lpos;
  undefined1 local_60 [8];
  string replace;
  bool in_help_local;
  bool symbolic_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  string *target_local;
  char *comment_local;
  ostream *os_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  replace.field_2._M_local_buf[0xf] = symbolic;
  replace.field_2._M_local_buf[0xe] = in_help;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_60);
    if (comment != (char *)0x0) {
      std::__cxx11::string::operator=((string *)local_60,comment);
      rpos = 0;
      while (local_80 = std::__cxx11::string::find((char)local_60,10), local_80 != -1) {
        poVar3 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)local_a0,(ulong)local_60);
        poVar3 = std::operator<<(poVar3,local_a0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string(local_a0);
        rpos = local_80 + 1;
      }
      poVar3 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)((long)&tgt.field_2 + 8),(ulong)local_60);
      poVar3 = std::operator<<(poVar3,(string *)(tgt.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)(tgt.field_2._M_local_buf + 8));
    }
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,pcVar4,(allocator *)((long)&space + 7));
    MaybeConvertToRelativePath(&local_100,this,&local_120,target);
    auVar7 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)local_e0,auVar7._0_8_,auVar7._8_8_);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&space + 7));
    sym = "";
    lVar5 = std::__cxx11::string::size();
    if (lVar5 == 1) {
      sym = " ";
    }
    if ((replace.field_2._M_local_buf[0xf] & 1U) != 0) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"CMAKE_MAKE_SYMBOLIC_RULE",&local_159);
      pcVar4 = cmMakefile::GetDefinition(this_00,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      local_138 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        cmMakeSafe::cmMakeSafe(&local_168,(string *)local_e0);
        poVar3 = ::operator<<(os,&local_168);
        poVar3 = std::operator<<(poVar3,sym);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,local_138);
        std::operator<<(poVar3,"\n");
      }
    }
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(depends);
    if (bVar1) {
      cmMakeSafe::cmMakeSafe((cmMakeSafe *)((long)&binDir.field_2 + 8),(string *)local_e0);
      poVar3 = ::operator<<(os,(cmMakeSafe *)((long)&binDir.field_2 + 8));
      poVar3 = std::operator<<(poVar3,sym);
      std::operator<<(poVar3,":\n");
    }
    else {
      pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_190,pcVar4,(allocator *)((long)&dep._M_current + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&dep._M_current + 7));
      local_1a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(depends);
      while( true ) {
        local_1a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(depends);
        bVar1 = __gnu_cxx::operator!=(&local_1a0,&local_1a8);
        if (!bVar1) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_1a0);
        std::__cxx11::string::operator=((string *)local_60,(string *)pbVar6);
        MaybeConvertToRelativePath(&local_1e8,this,(string *)local_190,(string *)local_60);
        auVar7 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_1c8,auVar7._0_8_,auVar7._8_8_);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        cmMakeSafe::cmMakeSafe(&local_1f0,(string *)local_e0);
        poVar3 = ::operator<<(os,&local_1f0);
        poVar3 = std::operator<<(poVar3,sym);
        poVar3 = std::operator<<(poVar3,": ");
        cmMakeSafe::cmMakeSafe(&local_1f8,(string *)local_60);
        poVar3 = ::operator<<(poVar3,&local_1f8);
        std::operator<<(poVar3,"\n");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1a0);
      }
      std::__cxx11::string::~string((string *)local_190);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"\t",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"\n",&local_289);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_218,&local_238,commands,&local_260,&local_288);
    poVar3 = std::operator<<(os,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    if (((replace.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this), !bVar1)) {
      poVar3 = std::operator<<(os,".PHONY : ");
      cmMakeSafe::cmMakeSafe(&local_298,(string *)local_e0);
      poVar3 = ::operator<<(poVar3,&local_298);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(os,"\n");
    if ((replace.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LocalHelp,target);
    }
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    cmSystemTools::Error
              ("No target for WriteMakeRule! called with comment: ",comment,(char *)0x0,(char *)0x0)
    ;
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    cmSystemTools::Error("No target for WriteMakeRule! called with comment: ",
                         comment);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target)
      .c_str());

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::vector<std::string>::const_iterator dep = depends.begin();
         dep != depends.end(); ++dep) {
      replace = *dep;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace).c_str());
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}